

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

mbedtls_ecp_curve_info * mbedtls_ecp_curve_info_from_name(char *name)

{
  int iVar1;
  mbedtls_ecp_curve_info *pmVar2;
  
  if (name != (char *)0x0) {
    for (pmVar2 = ecp_supported_curves; pmVar2->grp_id != MBEDTLS_ECP_DP_NONE; pmVar2 = pmVar2 + 1)
    {
      iVar1 = strcmp(pmVar2->name,name);
      if (iVar1 == 0) {
        return pmVar2;
      }
    }
  }
  return (mbedtls_ecp_curve_info *)0x0;
}

Assistant:

const mbedtls_ecp_curve_info *mbedtls_ecp_curve_info_from_name( const char *name )
{
    const mbedtls_ecp_curve_info *curve_info;

    if( name == NULL )
        return( NULL );

    for( curve_info = mbedtls_ecp_curve_list();
         curve_info->grp_id != MBEDTLS_ECP_DP_NONE;
         curve_info++ )
    {
        if( strcmp( curve_info->name, name ) == 0 )
            return( curve_info );
    }

    return( NULL );
}